

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef::~IfcCircleHollowProfileDef
          (IfcCircleHollowProfileDef *this)

{
  pointer pcVar1;
  undefined1 *puVar2;
  
  (this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8a0e78;
  *(undefined8 *)&this->field_0xa0 = 0x8a0ea0;
  pcVar1 = (this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
           ProfileName.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      &(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
       ProfileName.ptr.field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10;
  if (puVar2 != &(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.
                 super_IfcProfileDef.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>
                 .field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcCircleHollowProfileDef() : Object("IfcCircleHollowProfileDef") {}